

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.c
# Opt level: O2

void message_display(tgestate_t *state)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint8_t *puVar4;
  char *pcharacter;
  undefined8 uVar5;
  uint uVar6;
  
  uVar2 = (state->messages).display_delay;
  if (uVar2 == '\0') {
    bVar3 = (state->messages).display_index;
    if (bVar3 == 0x80) {
      puVar1 = (state->messages).queue + 2;
      puVar4 = (state->messages).queue_pointer;
      if (puVar4 != puVar1) {
        (state->messages).current_character = messages_table[(state->messages).queue[2]];
        uVar5 = *(undefined8 *)((state->messages).queue + 10);
        *(undefined8 *)(state->messages).queue = *(undefined8 *)puVar1;
        *(undefined8 *)((state->messages).queue + 8) = uVar5;
        (state->messages).queue_pointer = puVar4 + -2;
        (state->messages).display_index = '\0';
      }
    }
    else {
      if (0x80 < bVar3) {
        uVar6 = bVar3 - 1;
        (state->messages).display_index = (uint8_t)uVar6;
        plot_single_glyph(state,0x20,(state->speccy->screen).pixels + (ulong)(uVar6 & 0x7f) + 0x10e0
                         );
        return;
      }
      pcharacter = (state->messages).current_character;
      plot_glyph(state,pcharacter,(state->speccy->screen).pixels + (ulong)bVar3 + 0x10e0);
      (state->messages).display_index = bVar3 + 1;
      if (pcharacter[1] == '\0') {
        (state->messages).display_delay = '\x1f';
        (state->messages).display_index = bVar3 + 1 | 0x80;
      }
      else {
        (state->messages).current_character = pcharacter + 1;
      }
    }
  }
  else {
    (state->messages).display_delay = uVar2 + 0xff;
  }
  return;
}

Assistant:

void message_display(tgestate_t *state)
{
  uint8_t     index;   /* was A */
  const char *pmsgchr; /* was HL */
  uint8_t    *pscr;    /* was DE */

  assert(state != NULL);

  /* Proceed only if message_display_counter is zero. */
  if (state->messages.display_delay > 0)
  {
    state->messages.display_delay--;
    return;
  }

  index = state->messages.display_index;
  if (index == MESSAGE_NEXT_FLAG)
  {
    next_message(state);
  }
  else if (index > MESSAGE_NEXT_FLAG)
  {
    wipe_message(state);
  }
  else
  {
    pmsgchr = state->messages.current_character;
    pscr    = &state->speccy->screen.pixels[screen_text_start_address + index];
    (void) plot_glyph(state, pmsgchr, pscr);

    state->messages.display_index = index + 1; // Conv: Original used (pscr & 31). CHECK

    if (*++pmsgchr == '\0') /* end of string (0xFF in original game) */
    {
      /* Leave the message for 31 turns, then wipe it. */
      state->messages.display_delay = 31;
      state->messages.display_index |= MESSAGE_NEXT_FLAG;
    }
    else
    {
      state->messages.current_character = pmsgchr;
    }
  }
}